

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseBlockDeclaration(WastParser *this,BlockDeclaration *decl)

{
  bool bVar1;
  Result RVar2;
  undefined1 local_110 [8];
  FuncDeclaration func_decl;
  BlockDeclaration *decl_local;
  WastParser *this_local;
  
  func_decl.sig.result_type_names._M_h._M_single_bucket = (__node_base_ptr)decl;
  FuncDeclaration::FuncDeclaration((FuncDeclaration *)local_110);
  RVar2 = ParseTypeUseOpt(this,(FuncDeclaration *)local_110);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ParseUnboundFuncSignature
                      (this,(FuncSignature *)((long)&func_decl.type_var.field_2 + 0x18));
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *(byte *)&(func_decl.sig.result_type_names._M_h._M_single_bucket)->_M_nxt = local_110[0] & 1;
      Var::operator=((Var *)(func_decl.sig.result_type_names._M_h._M_single_bucket + 1),
                     (Var *)&func_decl);
      FuncSignature::operator=
                ((FuncSignature *)(func_decl.sig.result_type_names._M_h._M_single_bucket + 10),
                 (FuncSignature *)((long)&func_decl.type_var.field_2 + 0x18));
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  FuncDeclaration::~FuncDeclaration((FuncDeclaration *)local_110);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseBlockDeclaration(BlockDeclaration* decl) {
  WABT_TRACE(ParseBlockDeclaration);
  FuncDeclaration func_decl;
  CHECK_RESULT(ParseTypeUseOpt(&func_decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&func_decl.sig));
  decl->has_func_type = func_decl.has_func_type;
  decl->type_var = func_decl.type_var;
  decl->sig = func_decl.sig;
  return Result::Ok;
}